

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable-common.h
# Opt level: O3

bool google::sparsehash_internal::read_bigendian_number<_IO_FILE,unsigned_short>
               (_IO_FILE *fp,unsigned_short *value,size_t length)

{
  ulong uVar1;
  undefined8 in_RAX;
  size_t sVar2;
  int iVar3;
  ulong uVar4;
  bool bVar5;
  uchar byte;
  undefined8 uStack_38;
  
  *value = 0;
  if (length == 0) {
    return true;
  }
  uStack_38 = in_RAX;
  sVar2 = fread((void *)((long)&uStack_38 + 7),1,1,(FILE *)fp);
  if (sVar2 == 1) {
    iVar3 = (int)length * 8;
    uVar1 = 1;
    do {
      uVar4 = uVar1;
      iVar3 = iVar3 + -8;
      *value = *value | (ushort)uStack_38._7_1_ << ((byte)iVar3 & 0x1f);
      if (length == uVar4) break;
      sVar2 = fread((void *)((long)&uStack_38 + 7),1,1,(FILE *)fp);
      uVar1 = uVar4 + 1;
    } while (sVar2 == 1);
    bVar5 = length <= uVar4;
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool read_bigendian_number(INPUT* fp, IntType* value, size_t length) {
  *value = 0;
  unsigned char byte;
  // We require IntType to be unsigned or else the shifting gets all screwy.
  static_assert(static_cast<IntType>(-1) > static_cast<IntType>(0),
                "serializing int requires an unsigned type");
  for (size_t i = 0; i < length; ++i) {
    if (!read_data(fp, &byte, sizeof(byte))) return false;
    *value |= static_cast<IntType>(byte) << ((length - 1 - i) * 8);
  }
  return true;
}